

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpResponse.cpp
# Opt level: O0

string * __thiscall
higan::HttpResponse::StatusCodeToString_abi_cxx11_
          (string *__return_storage_ptr__,HttpResponse *this,StatusCode status_code)

{
  allocator<char> local_16;
  undefined1 local_15;
  int local_14;
  string *psStack_10;
  StatusCode status_code_local;
  string *result;
  
  local_14 = (int)this;
  local_15 = 0;
  psStack_10 = __return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"500 Internal Server Error",&local_16);
  std::allocator<char>::~allocator(&local_16);
  if (local_14 == 200) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"200 OK");
  }
  else if (local_14 == 400) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"400 Bad Request");
  }
  else if (local_14 == 0x194) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"404 Not Found");
  }
  else if (local_14 == 500) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"500 Internal Server Error");
  }
  return __return_storage_ptr__;
}

Assistant:

std::string HttpResponse::StatusCodeToString(HttpResponse::StatusCode status_code)
{
	std::string result = "500 Internal Server Error";
	switch (status_code)
	{
		case STATUS_200_OK:
			result = "200 OK";
			break;
		case STATUS_400_BAD_REQUEST:
			result = "400 Bad Request";
			break;
		case STATUS_404_NOT_FOUND:
			result = "404 Not Found";
			break;
		case STATUS_500_SERVICE_ERROR:
			result = "500 Internal Server Error";
			break;
	}

	return result;
}